

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient> *this,
          void *pointer)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined8 *puVar12;
  Fault local_60;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  
  if (pointer == (void *)0x0) {
    return;
  }
  _kjCondition.left = (uint *)((long)pointer + 0x14);
  _kjCondition.result = *(int *)((long)pointer + 0x14) == 0;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    puVar12 = *(undefined8 **)((long)pointer + 0x38);
    puVar1 = *(undefined8 **)((long)pointer + 0x48);
    plVar2 = *(long **)((long)pointer + 0x50);
    puVar3 = *(undefined8 **)((long)pointer + 0x58);
    puVar10 = *(undefined8 **)((long)pointer + 0x60);
    plVar4 = *(long **)((long)pointer + 0x70);
    plVar8 = plVar2;
    while (plVar8 = plVar8 + 1, plVar8 < plVar4) {
      lVar5 = *plVar8;
      lVar11 = 0;
      do {
        plVar6 = *(long **)(lVar5 + 8 + lVar11);
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)(lVar5 + 8 + lVar11) = 0;
          (**(code **)**(undefined8 **)(lVar5 + lVar11))
                    (*(undefined8 **)(lVar5 + lVar11),(long)plVar6 + *(long *)(*plVar6 + -0x10));
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x200);
    }
    if (plVar2 == plVar4) {
      for (; puVar12 != puVar3; puVar12 = puVar12 + 2) {
        plVar2 = (long *)puVar12[1];
        if (plVar2 != (long *)0x0) {
          puVar12[1] = 0;
          (*(code *)**(undefined8 **)*puVar12)
                    ((undefined8 *)*puVar12,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    else {
      for (; puVar12 != puVar1; puVar12 = puVar12 + 2) {
        plVar2 = (long *)puVar12[1];
        if (plVar2 != (long *)0x0) {
          puVar12[1] = 0;
          (*(code *)**(undefined8 **)*puVar12)
                    ((undefined8 *)*puVar12,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
      for (; puVar10 != puVar3; puVar10 = puVar10 + 2) {
        plVar2 = (long *)puVar10[1];
        if (plVar2 != (long *)0x0) {
          puVar10[1] = 0;
          (*(code *)**(undefined8 **)*puVar10)
                    ((undefined8 *)*puVar10,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    if (*(long *)((long)pointer + 0x28) != 0) {
      uVar7 = *(ulong *)((long)pointer + 0x70);
      if (*(ulong *)((long)pointer + 0x50) < uVar7 + 8) {
        uVar9 = *(ulong *)((long)pointer + 0x50) - 8;
        do {
          puVar12 = (undefined8 *)(uVar9 + 8);
          uVar9 = uVar9 + 8;
          operator_delete((void *)*puVar12,0x200);
        } while (uVar9 < uVar7);
      }
      operator_delete(*(void **)((long)pointer + 0x28),*(long *)((long)pointer + 0x30) << 3);
    }
    plVar2 = *(long **)((long)pointer + 0x20);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    operator_delete(pointer,0x78);
    return;
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[90]>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x195b,FAILED,"concurrentRequests == 0",
             "_kjCondition,\"ConcurrencyLimitingHttpClient getting destroyed when concurrent requests \" \"are still active\""
             ,&_kjCondition,
             (char (*) [90])
             "ConcurrencyLimitingHttpClient getting destroyed when concurrent requests are still active"
            );
  Debug::Fault::fatal(&local_60);
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }